

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

int __thiscall
lossless_neural_sound::expression_compiler::expression::Sum::structurally_compare_implementation
          (Sum *this,Expression_node *rt)

{
  uint uVar1;
  uint uVar2;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x437,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Sum::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  if ((rt->super_Node)._vptr_Node == (_func_int **)&PTR__Node_00127a38) {
    uVar1 = Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>::
            structurally_compare_tree
                      (&this->
                        super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>
                       ,(Balanced_tree<lossless_neural_sound::expression_compiler::expression::Sum>
                         *)rt);
  }
  else {
    uVar2 = (*(rt->super_Node)._vptr_Node[6])(rt);
    uVar1 = 0xffffffff;
    if (uVar2 < 3) {
      uVar1 = (uint)(uVar2 != 2);
    }
  }
  return uVar1;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *sum = dynamic_cast<const Sum *>(rt))
        {
            return structurally_compare_tree(sum);
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Sum < rt_kind)
            return -1;
        if(Kind::Sum > rt_kind)
            return 1;
        return 0;
    }